

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

int stats_arenas_i_bins_j_nonfull_slabs_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ulong uVar1;
  int iVar2;
  size_t in_RAX;
  ctl_arena_t *pcVar3;
  size_t __n;
  size_t oldval;
  size_t local_38;
  
  local_38 = in_RAX;
  iVar2 = pthread_mutex_trylock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  if (iVar2 != 0) {
    malloc_mutex_lock_slow(&ctl_mtx);
    ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  ctl_mtx.field_0.field_0.prof_data.n_lock_ops = ctl_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(ctl_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    ctl_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(ctl_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    ctl_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  iVar2 = 1;
  if (newp == (void *)0x0 && newlen == 0) {
    pcVar3 = arenas_i(mib[2]);
    local_38 = pcVar3->astats->bstats[mib[4]].nonfull_slabs;
    iVar2 = 0;
    if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
      uVar1 = *oldlenp;
      if (uVar1 == 8) {
        *(size_t *)oldp = local_38;
        iVar2 = 0;
      }
      else {
        __n = 8;
        if (uVar1 < 8) {
          __n = uVar1;
        }
        memcpy(oldp,&local_38,__n);
        iVar2 = 0x16;
      }
    }
  }
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  return iVar2;
}

Assistant:

static const ctl_named_node_t *
stats_arenas_i_bins_j_index(tsdn_t *tsdn, const size_t *mib,
    size_t miblen, size_t j) {
	if (j > SC_NBINS) {
		return NULL;
	}
	return super_stats_arenas_i_bins_j_node;
}